

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

JoinCondition *
duckdb::JoinCondition::Deserialize(JoinCondition *__return_storage_ptr__,Deserializer *deserializer)

{
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,100,"left",&__return_storage_ptr__->left);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0x65,"right",&__return_storage_ptr__->right);
  Deserializer::ReadProperty<duckdb::ExpressionType>
            (deserializer,0x66,"comparison",&__return_storage_ptr__->comparison);
  return __return_storage_ptr__;
}

Assistant:

JoinCondition JoinCondition::Deserialize(Deserializer &deserializer) {
	JoinCondition result;
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(100, "left", result.left);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(101, "right", result.right);
	deserializer.ReadProperty<ExpressionType>(102, "comparison", result.comparison);
	return result;
}